

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O1

void __thiscall
ExprFunctionContextAccess::ExprFunctionContextAccess
          (ExprFunctionContextAccess *this,SynBase *source,TypeBase *type,FunctionData *function,
          VariableData *contextVariable)

{
  (this->super_ExprBase).typeID = 0x23;
  (this->super_ExprBase).source = source;
  (this->super_ExprBase).type = type;
  (this->super_ExprBase).next = (ExprBase *)0x0;
  (this->super_ExprBase).listed = false;
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248c40;
  this->function = function;
  this->contextVariable = contextVariable;
  if (function == (FunctionData *)0x0) {
    __assert_fail("function",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3b7,
                  "ExprFunctionContextAccess::ExprFunctionContextAccess(SynBase *, TypeBase *, FunctionData *, VariableData *)"
                 );
  }
  if (contextVariable->type == type) {
    if (contextVariable->lookupOnly != true) {
      return;
    }
    __assert_fail("!contextVariable->lookupOnly",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3b9,
                  "ExprFunctionContextAccess::ExprFunctionContextAccess(SynBase *, TypeBase *, FunctionData *, VariableData *)"
                 );
  }
  __assert_fail("type == contextVariable->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x3b8,
                "ExprFunctionContextAccess::ExprFunctionContextAccess(SynBase *, TypeBase *, FunctionData *, VariableData *)"
               );
}

Assistant:

ExprFunctionContextAccess(SynBase *source, TypeBase *type, FunctionData *function, VariableData *contextVariable): ExprBase(myTypeID, source, type), function(function), contextVariable(contextVariable)
	{
		assert(function);
		assert(type == contextVariable->type);
		assert(!contextVariable->lookupOnly);
	}